

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SBG.cpp
# Opt level: O2

void * SBGThread(void *pParam)

{
  ulong uVar1;
  undefined1 auVar2 [13];
  bool bVar3;
  uint5 uVar4;
  bool bVar5;
  undefined1 auVar6 [13];
  int iVar7;
  size_t sVar8;
  char *pcVar9;
  time_t tVar10;
  ulong uVar11;
  long lVar12;
  double local_2c30;
  double local_2c28;
  int local_2c20;
  int local_2c1c;
  interval local_2c18;
  interval local_2c00;
  interval local_2be8;
  uint local_2bd0;
  uint local_2bcc;
  timeval local_2bc8;
  double local_2bb0;
  double local_2ba8;
  double local_2ba0;
  undefined1 local_2b98 [16];
  int local_2b88;
  int local_2b84;
  undefined1 local_2b80 [16];
  undefined1 local_2b70 [16];
  CHRONO chrono_period;
  char szTemp [256];
  SBGDATA sbgdata;
  char szSaveFilePath [256];
  SBG sbg;
  
  memset(&sbg,0,0x1730);
  local_2bc8.tv_sec = 0;
  local_2bc8.tv_usec = 0;
  memset(&sbgdata,0,0x11b0);
  GNSSqualitySBG = 0;
  StartChrono(&chrono_period);
  local_2c20 = 0x32;
  bVar3 = false;
  local_2c1c = 0;
LAB_00173aeb:
  bVar3 = !bVar3;
  while( true ) {
    StopChronoQuick(&chrono_period);
    StartChrono(&chrono_period);
    if (bPauseSBG == 0) break;
    if (!bVar3) {
      puts("SBG paused.");
      GNSSqualitySBG = 0;
      DisconnectSBG(&sbg);
    }
    if (bExit != 0) goto LAB_001745ba;
    mSleep(100);
    bVar3 = true;
  }
  if (bRestartSBG == 0) {
    if (bVar3) goto LAB_00173b91;
    iVar7 = GetFrameSBG(&sbg,&sbgdata);
    if (iVar7 != 0) {
      puts("Connection to a SBG lost.");
      GNSSqualitySBG = 0;
      DisconnectSBG(&sbg);
      lVar12 = (long)local_2c20;
      goto LAB_00173baa;
    }
    iVar7 = gettimeofday(&local_2bc8,(__timezone_ptr_t)0x0);
    if (iVar7 != 0) {
      local_2bc8.tv_sec = 0;
      local_2bc8.tv_usec = 0;
    }
    pthread_mutex_lock((pthread_mutex_t *)&StateVariablesCS);
    local_2c30 = fmod_2PI(sbgdata.Roll);
    interval::interval(&local_2be8,&local_2c30);
    local_2c28 = (double)CONCAT44((uint)((ulong)phi_ahrs_acc >> 0x20) ^ DAT_0018d0f0._4_4_,
                                  SUB84(phi_ahrs_acc,0) ^ (uint)DAT_0018d0f0);
    interval::interval(&local_2c00,&local_2c28,&phi_ahrs_acc);
    operator+(&local_2be8,&local_2c00);
    interval::operator=((interval *)&phi_ahrs,&local_2c18);
    interval::interval(&local_2be8,&sbgdata.gyrX);
    local_2c30 = -omegax_ahrs_acc;
    interval::interval(&local_2c00,&local_2c30,&omegax_ahrs_acc);
    operator+(&local_2be8,&local_2c00);
    interval::operator=((interval *)&omegax_ahrs,&local_2c18);
    local_2c30 = fmod_2PI(-sbgdata.Pitch);
    interval::interval(&local_2be8,&local_2c30);
    local_2c28 = -theta_ahrs_acc;
    interval::interval(&local_2c00,&local_2c28,&theta_ahrs_acc);
    operator+(&local_2be8,&local_2c00);
    interval::operator=((interval *)&theta_ahrs,&local_2c18);
    local_2c30 = -sbgdata.gyrY;
    interval::interval(&local_2be8,&local_2c30);
    local_2c28 = -omegay_ahrs_acc;
    interval::interval(&local_2c00,&local_2c28,&omegay_ahrs_acc);
    operator+(&local_2be8,&local_2c00);
    interval::operator=((interval *)&omegay_ahrs,&local_2c18);
    local_2c30 = fmod_2PI((1.5707963267948966 - sbgdata.Yaw) - angle_env);
    interval::interval(&local_2be8,&local_2c30);
    local_2c28 = -psi_ahrs_acc;
    interval::interval(&local_2c00,&local_2c28,&psi_ahrs_acc);
    operator+(&local_2be8,&local_2c00);
    interval::operator=((interval *)&psi_ahrs,&local_2c18);
    local_2c30 = -sbgdata.gyrZ;
    interval::interval(&local_2be8,&local_2c30);
    local_2c28 = -omegaz_ahrs_acc;
    interval::interval(&local_2c00,&local_2c28,&omegaz_ahrs_acc);
    operator+(&local_2be8,&local_2c00);
    interval::operator=((interval *)&omegaz_ahrs,&local_2c18);
    interval::interval(&local_2be8,&sbgdata.accX);
    local_2c30 = -accrx_ahrs_acc;
    interval::interval(&local_2c00,&local_2c30,&accrx_ahrs_acc);
    operator+(&local_2be8,&local_2c00);
    interval::operator=((interval *)&accrx_ahrs,&local_2c18);
    local_2c30 = -sbgdata.accY;
    interval::interval(&local_2be8,&local_2c30);
    local_2c28 = -accry_ahrs_acc;
    interval::interval(&local_2c00,&local_2c28,&accry_ahrs_acc);
    operator+(&local_2be8,&local_2c00);
    interval::operator=((interval *)&accry_ahrs,&local_2c18);
    local_2c30 = -sbgdata.accZ;
    interval::interval(&local_2be8,&local_2c30);
    local_2c28 = -accrz_ahrs_acc;
    interval::interval(&local_2c00,&local_2c28,&accrz_ahrs_acc);
    operator+(&local_2be8,&local_2c00);
    interval::operator=((interval *)&accrz_ahrs,&local_2c18);
    if ((((sbgdata.positionStdDev[0] <= 0.0) ||
         (sbg.gpsaccuracythreshold / 3.0 <= (double)sbgdata.positionStdDev[0])) ||
        (sbgdata.positionStdDev[1] <= 0.0)) ||
       (sbg.gpsaccuracythreshold / 3.0 <= (double)sbgdata.positionStdDev[1])) {
      GNSSqualitySBG = 0;
    }
    else {
      GNSSqualitySBG = 1;
      ComputeGNSSPosition(sbgdata.Lat,sbgdata.Long,sbgdata.Alt,1,0,0.0);
      local_2b70 = (undefined1  [16])0x0;
      local_2b80 = (undefined1  [16])0x0;
      local_2b84 = sbgdata.UTCTime.Year - 0x76c;
      local_2b88 = sbgdata.UTCTime.Month - 1;
      auVar2[0xc] = sbgdata.UTCTime.Seconds;
      auVar2._0_12_ = ZEXT712(0);
      uVar4 = CONCAT32(auVar2._10_3_,(ushort)sbgdata.UTCTime.Minute);
      auVar6._5_8_ = 0;
      auVar6._0_5_ = uVar4;
      local_2b98[3] = 0;
      local_2b98._0_3_ = auVar2._10_3_ >> 0x10;
      local_2b98._4_4_ = (int)uVar4;
      local_2b98._8_4_ = (int)CONCAT72(SUB137(auVar6 << 0x40,6),(ushort)sbgdata.UTCTime.Hour);
      local_2b98[0xc] = sbgdata.UTCTime.Day;
      local_2b98._13_3_ = 0;
      tVar10 = timegm((tm *)local_2b98);
      utc = (double)tVar10 * 1000.0 + (double)sbgdata.UTCTime.Nanoseconds / 1000000.0;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&StateVariablesCS);
    if (sbg.bSaveRawData != 0) {
      local_2bcc = sbgdata.UTCTime.Nanoseconds;
      local_2bd0 = (uint)sbgdata.UTCTime.Year;
      local_2ba0 = (double)((uint)sbgdata.UTCTime._7_4_ >> 0x18);
      local_2ba8 = sbgdata.accX;
      local_2bb0 = sbgdata.accY;
      fprintf((FILE *)sbg.pfSaveFile,
              "%d;%d;%d;%d;%d;%d;%d;%d;%f;%d;%d;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%f;%.8f;%.8f;%f;%f;%f;%f;%d;%d;%f;%f;%f;%f;\n"
              ,local_2ba0,sbgdata.accX,sbgdata.accY,sbgdata.accZ,sbgdata.gyrX,sbgdata.gyrY,
              sbgdata.gyrZ,sbgdata.magX,(ulong)sbgdata.TS,0,(ulong)sbgdata.UTCTime.Nanoseconds,
              (ulong)local_2bd0,(uint)sbgdata.UTCTime.Month,sbgdata.UTCTime._7_4_ & 0xff,
              (uint)sbgdata.UTCTime._7_4_ >> 8 & 0xff,(uint)sbgdata.UTCTime._7_4_ >> 0x10 & 0xff,
              (uint)sbgdata.UTCTime.Valid,(uint)sbgdata.Status,sbgdata.magY,sbgdata.magZ,
              sbgdata.roll,sbgdata.pitch,sbgdata.yaw,sbgdata.Lat,sbgdata.Long,sbgdata.Alt,
              sbgdata.Vel_X,sbgdata.Vel_Y,sbgdata.Vel_Z,(undefined4)local_2bc8.tv_sec,
              (undefined4)local_2bc8.tv_usec,sbgdata.heave_period,sbgdata.surge,sbgdata.sway,
              sbgdata.heave);
      goto LAB_00173d75;
    }
  }
  else {
    if (!bVar3) {
      puts("Restarting a SBG.");
      GNSSqualitySBG = 0;
      DisconnectSBG(&sbg);
    }
    bRestartSBG = 0;
LAB_00173b91:
    iVar7 = ConnectSBG(&sbg,"SBG0.txt");
    if (iVar7 != 0) {
      GNSSqualitySBG = 0;
      lVar12 = 1000;
LAB_00173baa:
      mSleep(lVar12);
      local_2c1c = local_2c1c + 1;
      if (ExitOnErrorCount <= local_2c1c && 0 < ExitOnErrorCount) {
        bExit = 1;
LAB_001745ba:
        bVar5 = true;
        goto LAB_001745bc;
      }
      bVar3 = false;
      bVar5 = true;
      goto LAB_00173d87;
    }
    local_2c20 = sbg.threadperiod;
    local_2bc8.tv_sec = 0;
    local_2bc8.tv_usec = 0;
    memset(&sbgdata,0,0x11b0);
    if (sbg.pfSaveFile != (FILE *)0x0) {
      fclose((FILE *)sbg.pfSaveFile);
      sbg.pfSaveFile = (FILE *)0x0;
    }
    if (sbg.bSaveRawData == 0) goto LAB_00173d82;
    if (sbg.szCfgFilePath[0] == '\0') {
      builtin_strncpy(szTemp,"sbg",4);
    }
    else {
      sprintf(szTemp,"%.127s",sbg.szCfgFilePath);
    }
    sVar8 = strlen(szTemp);
    iVar7 = (int)sVar8 + 1;
    uVar11 = sVar8 & 0xffffffff;
    do {
      if ((int)uVar11 < 1) goto LAB_00173cfd;
      uVar1 = uVar11 - 1;
      iVar7 = iVar7 + -1;
      lVar12 = uVar11 - 1;
      uVar11 = uVar1;
    } while (szTemp[lVar12] != '.');
    if ((uVar1 != 0) && (iVar7 <= (int)sVar8)) {
      memset(szTemp + (uVar1 & 0xffffffff),0,sVar8 - (uVar1 & 0xffffffff));
    }
LAB_00173cfd:
    pthread_mutex_lock((pthread_mutex_t *)&strtimeCS);
    pcVar9 = strtimeex_fns();
    sprintf(szSaveFilePath,"log/%.127s_%.64s.csv",szTemp,pcVar9);
    pthread_mutex_unlock((pthread_mutex_t *)&strtimeCS);
    sbg.pfSaveFile = (FILE *)fopen(szSaveFilePath,"w");
    if ((FILE *)sbg.pfSaveFile == (FILE *)0x0) {
      puts("Unable to create SBG data file.");
      bVar5 = false;
      goto LAB_001745bc;
    }
    fwrite("PacketCounter;SampleTimeFine;UTC_Nano;UTC_Year;UTC_Month;UTC_Day;UTC_Hour;UTC_Minute;UTC_Second;UTC_Valid;StatusWord;Acc_X (in m/s2);Acc_Y (in m/s2);Acc_Z (in m/s2);Gyr_X (in rad/s);Gyr_Y (in rad/s);Gyr_Z (in rad/s);Mag_X;Mag_Y;Mag_Z;Roll (in deg);Pitch (in deg);Yaw (in deg);Latitude (in deg);Longitude (in deg);Altitude (in m);Vel_X (in m/s);Vel_Y (in m/s);Vel_Z (in m/s);tv_sec;tv_usec;heave_period (in s);surge (in m);sway (in m);heave (in m);\n"
           ,0x1c0,1,(FILE *)sbg.pfSaveFile);
LAB_00173d75:
    fflush((FILE *)sbg.pfSaveFile);
  }
LAB_00173d82:
  bVar5 = false;
  bVar3 = true;
LAB_00173d87:
  if (bExit != 0) {
LAB_001745bc:
    StopChronoQuick(&chrono_period);
    GNSSqualitySBG = 0;
    if (sbg.pfSaveFile != (FILE *)0x0) {
      fclose((FILE *)sbg.pfSaveFile);
      sbg.pfSaveFile = (FILE *)0x0;
    }
    if (!bVar5) {
      DisconnectSBG(&sbg);
    }
    if (bExit == 0) {
      bExit = 1;
    }
    return (void *)0x0;
  }
  goto LAB_00173aeb;
}

Assistant:

THREAD_PROC_RETURN_VALUE SBGThread(void* pParam)
{
	SBG sbg;
	struct timeval tv;
	SBGDATA sbgdata;
	struct tm t;
	time_t tt = 0;
	BOOL bConnected = FALSE;
	CHRONO chrono_period;
	int threadperiod = 50;
	int errcount = 0;
	int i = 0;
	char szSaveFilePath[256];
	char szTemp[256];

	UNREFERENCED_PARAMETER(pParam);

	memset(&sbg, 0, sizeof(SBG));

	memset(&tv, 0, sizeof(tv));
	memset(&sbgdata, 0, sizeof(sbgdata));

	GNSSqualitySBG = GNSS_NO_FIX;

	StartChrono(&chrono_period);

	for (;;)
	{
		StopChronoQuick(&chrono_period);
		StartChrono(&chrono_period);

#ifdef ENABLE_SBG_SDK_SUPPORT
		mSleep(threadperiod);
#endif // ENABLE_SBG_SDK_SUPPORT

		if (bPauseSBG)
		{
			if (bConnected)
			{
				printf("SBG paused.\n");
				GNSSqualitySBG = GNSS_NO_FIX;
				bConnected = FALSE;
				DisconnectSBG(&sbg);
			}
			if (bExit) break;
			mSleep(100);
			continue;
		}

		if (bRestartSBG)
		{
			if (bConnected)
			{
				printf("Restarting a SBG.\n");
				GNSSqualitySBG = GNSS_NO_FIX;
				bConnected = FALSE;
				DisconnectSBG(&sbg);
			}
			bRestartSBG = FALSE;
		}

		if (!bConnected)
		{
			if (ConnectSBG(&sbg, "SBG0.txt") == EXIT_SUCCESS) 
			{
				bConnected = TRUE; 
				threadperiod = sbg.threadperiod;

				memset(&tv, 0, sizeof(tv));
				memset(&sbgdata, 0, sizeof(sbgdata));

				if (sbg.pfSaveFile != NULL)
				{
					fclose(sbg.pfSaveFile); 
					sbg.pfSaveFile = NULL;
				}
				if ((sbg.bSaveRawData)&&(sbg.pfSaveFile == NULL)) 
				{
					if (strlen(sbg.szCfgFilePath) > 0)
					{
						sprintf(szTemp, "%.127s", sbg.szCfgFilePath);
					}
					else
					{
						sprintf(szTemp, "sbg");
					}
					// Remove the extension.
					for (i = (int)strlen(szTemp)-1; i >= 0; i--) { if (szTemp[i] == '.') break; }
					if ((i > 0)&&(i < (int)strlen(szTemp))) memset(szTemp+i, 0, strlen(szTemp)-i);
					//if (strlen(szTemp) > 4) memset(szTemp+strlen(szTemp)-4, 0, 4);
					EnterCriticalSection(&strtimeCS);
					sprintf(szSaveFilePath, LOG_FOLDER"%.127s_%.64s.csv", szTemp, strtimeex_fns());
					LeaveCriticalSection(&strtimeCS);
					sbg.pfSaveFile = fopen(szSaveFilePath, "w");
					if (sbg.pfSaveFile == NULL) 
					{
						printf("Unable to create SBG data file.\n");
						break;
					}
					fprintf(sbg.pfSaveFile, 
						"PacketCounter;SampleTimeFine;"
						"UTC_Nano;UTC_Year;UTC_Month;UTC_Day;UTC_Hour;UTC_Minute;UTC_Second;UTC_Valid;"
						"StatusWord;"
						"Acc_X (in m/s2);Acc_Y (in m/s2);Acc_Z (in m/s2);"
						"Gyr_X (in rad/s);Gyr_Y (in rad/s);Gyr_Z (in rad/s);"
						"Mag_X;Mag_Y;Mag_Z;"
						"Roll (in deg);Pitch (in deg);Yaw (in deg);"
						"Latitude (in deg);Longitude (in deg);Altitude (in m);"
						"Vel_X (in m/s);Vel_Y (in m/s);Vel_Z (in m/s);"
						"tv_sec;tv_usec;"
						"heave_period (in s);surge (in m);sway (in m);heave (in m);\n"
						); 
					fflush(sbg.pfSaveFile);
				}
			}
			else 
			{
				GNSSqualitySBG = GNSS_NO_FIX;
				bConnected = FALSE;
				mSleep(1000);
			}
		}
		else
		{
#ifdef ENABLE_SBG_SDK_SUPPORT
			if (GetLatestDataSBG(&sbg, &sbgdata) == EXIT_SUCCESS)
#else
			if (GetFrameSBG(&sbg, &sbgdata) == EXIT_SUCCESS)
#endif // ENABLE_SBG_SDK_SUPPORT
			{
				if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }

				EnterCriticalSection(&StateVariablesCS);

				phi_ahrs = fmod_2PI(sbgdata.Roll)+interval(-phi_ahrs_acc, phi_ahrs_acc);
				omegax_ahrs = sbgdata.gyrX+interval(-omegax_ahrs_acc, omegax_ahrs_acc);
				theta_ahrs = fmod_2PI(-sbgdata.Pitch)+interval(-theta_ahrs_acc, theta_ahrs_acc);
				omegay_ahrs = -sbgdata.gyrY+interval(-omegay_ahrs_acc, omegay_ahrs_acc);
				psi_ahrs = fmod_2PI(M_PI/2.0-sbgdata.Yaw-angle_env)+interval(-psi_ahrs_acc, psi_ahrs_acc);
				omegaz_ahrs = -sbgdata.gyrZ+interval(-omegaz_ahrs_acc, omegaz_ahrs_acc);
				accrx_ahrs = sbgdata.accX+interval(-accrx_ahrs_acc, accrx_ahrs_acc);
				accry_ahrs = -sbgdata.accY+interval(-accry_ahrs_acc, accry_ahrs_acc);
				accrz_ahrs = -sbgdata.accZ+interval(-accrz_ahrs_acc, accrz_ahrs_acc);

				// Check accuracy at 3*sigma to use GPS data.
				if ((sbgdata.positionStdDev[0] > 0)&&(sbgdata.positionStdDev[0] < sbg.gpsaccuracythreshold/3.0)&&
					(sbgdata.positionStdDev[1] > 0)&&(sbgdata.positionStdDev[1] < sbg.gpsaccuracythreshold/3.0))
				{
					GNSSqualitySBG = AUTONOMOUS_GNSS_FIX;
					ComputeGNSSPosition(sbgdata.Lat, sbgdata.Long, sbgdata.Alt, GNSSqualitySBG, 0, 0);
					// Get UTC as ms.
					memset(&t, 0, sizeof(t));
					t.tm_year = sbgdata.UTCTime.Year-1900; t.tm_mon = sbgdata.UTCTime.Month-1; t.tm_mday = sbgdata.UTCTime.Day; 
					t.tm_hour = sbgdata.UTCTime.Hour; t.tm_min = sbgdata.UTCTime.Minute; t.tm_sec = sbgdata.UTCTime.Seconds; t.tm_isdst = 0;
					tt = timegm(&t);
					utc = tt*1000.0+sbgdata.UTCTime.Nanoseconds/1000000.0;
				}
				else
				{
					GNSSqualitySBG = GNSS_NO_FIX;
				}

				LeaveCriticalSection(&StateVariablesCS);

				if (sbg.bSaveRawData)
				{
					fprintf(sbg.pfSaveFile, 
						"%d;%d;"
						"%d;%d;%d;%d;%d;%d;%f;%d;"
						"%d;"
						"%f;%f;%f;"
						"%f;%f;%f;"
						"%f;%f;%f;"
						"%f;%f;%f;"
						"%.8f;%.8f;%f;"
						"%f;%f;%f;"
						"%d;%d;"
						"%f;%f;%f;%f;\n", 
						(int)sbgdata.TS, (int)0, 
						(int)sbgdata.UTCTime.Nanoseconds, (int)sbgdata.UTCTime.Year, (int)sbgdata.UTCTime.Month, (int)sbgdata.UTCTime.Day, (int)sbgdata.UTCTime.Hour, (int)sbgdata.UTCTime.Minute, (double)sbgdata.UTCTime.Seconds, (int)sbgdata.UTCTime.Valid, 
						(int)sbgdata.Status, 
						sbgdata.accX, sbgdata.accY, sbgdata.accZ, 
						sbgdata.gyrX, sbgdata.gyrY, sbgdata.gyrZ, 
						sbgdata.magX, sbgdata.magY, sbgdata.magZ, 
						sbgdata.roll, sbgdata.pitch, sbgdata.yaw, 
						sbgdata.Lat, sbgdata.Long, sbgdata.Alt, 
						sbgdata.Vel_X, sbgdata.Vel_Y, sbgdata.Vel_Z, 
						(int)tv.tv_sec, (int)tv.tv_usec, 
						sbgdata.heave_period, sbgdata.surge, sbgdata.sway, sbgdata.heave
						);
					fflush(sbg.pfSaveFile);
				}
			}
			else
			{
				printf("Connection to a SBG lost.\n");
				GNSSqualitySBG = GNSS_NO_FIX;
				bConnected = FALSE;
				DisconnectSBG(&sbg);
#ifndef ENABLE_SBG_SDK_SUPPORT
				mSleep(threadperiod);
#endif // !ENABLE_SBG_SDK_SUPPORT
			}
		}

		//printf("SBGThread period : %f s.\n", GetTimeElapsedChronoQuick(&chrono_period));
		if (!bConnected) { errcount++; if ((ExitOnErrorCount > 0)&&(errcount >= ExitOnErrorCount)) bExit = TRUE; }
		if (bExit) break;
	}